

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

iterator * __thiscall
idx2::IncreaseCapacity<unsigned_long,idx2::chunk_exp_info>
          (iterator *__return_storage_ptr__,idx2 *this,
          hash_table<unsigned_long,_idx2::chunk_exp_info> *Ht,iterator *ItIn)

{
  hash_table<unsigned_long,_idx2::chunk_exp_info> *Ht_00;
  hash_table<unsigned_long,_idx2::chunk_exp_info> *extraout_RDX;
  hash_table<unsigned_long,_idx2::chunk_exp_info> *Ht_01;
  chunk_exp_info *in_R8;
  undefined1 local_c0 [8];
  iterator Result;
  chunk_exp_info *local_90;
  hash_table<unsigned_long,_idx2::chunk_exp_info> *local_88;
  undefined1 local_80 [8];
  iterator It;
  hash_table<unsigned_long,_idx2::chunk_exp_info> NewHt;
  iterator *ItIn_local;
  hash_table<unsigned_long,_idx2::chunk_exp_info> *Ht_local;
  
  __return_storage_ptr__->Key = Ht->Keys;
  __return_storage_ptr__->Val = Ht->Vals;
  __return_storage_ptr__->Ht = (hash_table<unsigned_long,_idx2::chunk_exp_info> *)Ht->Stats;
  __return_storage_ptr__->Idx = Ht->Size;
  hash_table<unsigned_long,_idx2::chunk_exp_info>::hash_table
            ((hash_table<unsigned_long,_idx2::chunk_exp_info> *)&It.Idx);
  Init<unsigned_long,idx2::chunk_exp_info>
            ((hash_table<unsigned_long,_idx2::chunk_exp_info> *)&It.Idx,*(long *)(this + 0x20) + 1,
             *(allocator **)(this + 0x28));
  Begin<unsigned_long,idx2::chunk_exp_info>((iterator *)local_80,this,Ht_00);
  Ht_01 = extraout_RDX;
  while (End<unsigned_long,idx2::chunk_exp_info>((iterator *)&Result.Idx,this,Ht_01),
        It.Val != local_90 || It.Ht != local_88) {
    Insert<unsigned_long,idx2::chunk_exp_info>
              ((iterator *)local_c0,(idx2 *)&It.Idx,
               (hash_table<unsigned_long,_idx2::chunk_exp_info> *)local_80,It.Key,in_R8);
    if (*Ht->Keys == *(unsigned_long *)local_c0) {
      __return_storage_ptr__->Key = (unsigned_long *)local_c0;
      __return_storage_ptr__->Val = (chunk_exp_info *)Result.Key;
      __return_storage_ptr__->Ht = (hash_table<unsigned_long,_idx2::chunk_exp_info> *)Result.Val;
      __return_storage_ptr__->Idx = (i64)Result.Ht;
    }
    do {
      It.Ht = (hash_table<unsigned_long,_idx2::chunk_exp_info> *)((long)&(It.Ht)->Keys + 1);
    } while (*(char *)((long)&(It.Ht)->Keys +
                      (long)&(((It.Val)->ExpSizes).Stream.Alloc)->_vptr_allocator) != '\x02');
    local_80 = (undefined1  [8])(((It.Val)->ExpSizes).Stream.Data + (long)It.Ht * 8);
    Ht_01 = (hash_table<unsigned_long,_idx2::chunk_exp_info> *)((long)It.Ht * 0x90);
    It.Key = (unsigned_long *)((long)&Ht_01->Keys + ((It.Val)->ExpSizes).Stream.Bytes);
  }
  Dealloc<unsigned_long,idx2::chunk_exp_info>
            ((hash_table<unsigned_long,_idx2::chunk_exp_info> *)this);
  memcpy(this,&It.Idx,0x30);
  __return_storage_ptr__->Ht = (hash_table<unsigned_long,_idx2::chunk_exp_info> *)this;
  return __return_storage_ptr__;
}

Assistant:

typename hash_table<k, v>::iterator
IncreaseCapacity(hash_table<k, v>* Ht, const typename hash_table<k, v>::iterator& ItIn)
{
  auto ItOut = ItIn;
  hash_table<k, v> NewHt;
  Init(&NewHt, Ht->LogCapacity + 1, Ht->Alloc);
  for (auto It = Begin(*Ht); It != End(*Ht); ++It)
  {
    auto Result = Insert(&NewHt, *(It.Key), *(It.Val));
    if (*(ItIn.Key) == *(Result.Key))
      ItOut = Result;
  }
  Dealloc(Ht);
  *Ht = NewHt;
  ItOut.Ht = Ht;
  return ItOut;
}